

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::StartsWithOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  uint uVar3;
  int iVar4;
  void *__s2;
  void *__s1;
  bool bVar5;
  undefined8 local_38;
  void *local_30;
  undefined8 local_28;
  void *local_20;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pdVar2 = result->data;
  if (((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) &&
     ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar1 == (unsigned_long *)0x0 || ((*puVar1 & 1) != 0)))) {
    local_28 = *(undefined8 *)left->data;
    local_20 = *(void **)(left->data + 8);
    local_38 = *(ulong *)right->data;
    local_30 = *(void **)((long)right->data + 8);
    __s1 = local_20;
    if ((uint)local_28 < 0xd) {
      __s1 = (void *)((long)&local_28 + 4);
    }
    uVar3 = (uint)local_38;
    __s2 = local_30;
    if (uVar3 < 0xd) {
      __s2 = (void *)((long)&local_38 + 4);
    }
    if (uVar3 == 0) {
      bVar5 = true;
    }
    else if ((uint)local_28 < uVar3) {
      bVar5 = false;
    }
    else {
      iVar4 = bcmp(__s1,__s2,local_38 & 0xffffffff);
      bVar5 = iVar4 == 0;
    }
    *pdVar2 = bVar5;
    return;
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}